

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

GeneratorInfo * __thiscall
google::protobuf::compiler::CommandLineInterface::FindGeneratorByOption
          (CommandLineInterface *this,string *option)

{
  bool bVar1;
  GeneratorInfo *pGVar2;
  pointer prVar3;
  const_iterator it;
  iterator local_20;
  iterator local_10;
  
  local_20 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
             ::find<std::__cxx11::string>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
                         *)&this->generators_by_option_name_,option);
  local_10.ctrl_ = (ctrl_t *)0x0;
  bVar1 = absl::lts_20240722::container_internal::operator==(&local_20,&local_10);
  if (bVar1) {
    pGVar2 = (GeneratorInfo *)0x0;
  }
  else {
    prVar3 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
             ::iterator::operator->(&local_20);
    pGVar2 = &prVar3->second;
  }
  return pGVar2;
}

Assistant:

const CommandLineInterface::GeneratorInfo*
CommandLineInterface::FindGeneratorByOption(const std::string& option) const {
  auto it = generators_by_option_name_.find(option);
  if (it == generators_by_option_name_.end()) return nullptr;
  return &it->second;
}